

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sos2.h
# Opt level: O2

void __thiscall
mp::
SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOS2FromPL(SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,ItemType_conflict18 *cc)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *pFVar1;
  int v1;
  ulong uVar2;
  uint r;
  int __x;
  ulong uVar3;
  __type __x_00;
  double dVar4;
  double local_2c8;
  vector<int,_std::allocator<int>_> lambda;
  vector<int,_std::allocator<int>_> y;
  vector<double,_std::allocator<double>_> Ckr_1_dp1;
  vector<double,_std::allocator<double>_> Ckr_0_d;
  LinTerms local_260;
  LinTerms local_1e8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_170;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_d0;
  
  v1 = (int)((ulong)((long)(cc->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(cc->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  __x = v1 + -1;
  __x_00 = std::log2<int>(__x);
  dVar4 = ceil(__x_00);
  std::vector<int,_std::allocator<int>_>::vector(&lambda,&cc->v_);
  y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
       0xffffffff;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&lambda,(int *)&y);
  r = (uint)dVar4;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(&y,(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)(this->
                            super_BasicFuncConstrCvt<mp::SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            ).
                            super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            .mdl_cvt_,(long)(int)r,0.0,1e+100,INTEGER);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)r) {
    uVar2 = (ulong)r;
  }
  while (uVar2 != uVar3) {
    lambda.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    [-1] = *(int *)(CONCAT44(y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + uVar3 * 4);
    uVar3 = uVar3 + 1;
    MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::GetZZIExtendedColumn
              (&Ckr_0_d,&((this->
                          super_BasicFuncConstrCvt<mp::SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).
                          super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         .mdl_cvt_)->
                         super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ,r,(int)uVar3,0,__x);
    Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&Ckr_0_d,(double *)&Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>);
    pFVar1 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)(this->
                super_BasicFuncConstrCvt<mp::SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_;
    LinTerms::LinTerms(&local_1e8,&Ckr_0_d,&lambda);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_170,&local_1e8,(AlgConRhs<_1>)0x0,true);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>(pFVar1,&local_170);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_170);
    LinTerms::~LinTerms(&local_1e8);
    MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::GetZZIExtendedColumn
              ((vector<double,_std::allocator<double>_> *)
               &Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>,
               &((this->
                 super_BasicFuncConstrCvt<mp::SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).
                 super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_)->
                super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ,r,(int)uVar3,1,v1);
    local_2c8 = -1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)
               &Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>,&local_2c8);
    pFVar1 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)(this->
                super_BasicFuncConstrCvt<mp::SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_;
    LinTerms::LinTerms(&local_260,
                       (vector<double,_std::allocator<double>_> *)
                       &Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>,&lambda);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
              (&local_d0,&local_260,(AlgConRhs<1>)0x0,true);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(pFVar1,&local_d0);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_d0);
    LinTerms::~LinTerms(&local_260);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Ckr_1_dp1.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Ckr_0_d.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&y.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&lambda.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ConvertSOS2FromPL(const ItemType& cc) {
    const int d = int(cc.get_vars().size()-1);
    const int r = int(std::ceil(std::log2(d)));
    auto lambda = cc.get_vars();
    lambda.push_back(-1);             // reserve for 1 extra var
    auto y = GetMC().AddVars_returnIds(r, 0.0, 1e100, var::INTEGER);
    for (int k=1; k<=r; ++k) {
      lambda.back() = y[k-1];
      auto Ckr_0_d = GetMC().GetZZIExtendedColumn(r, k, 0, d);
      Ckr_0_d.push_back(-1.0);
      GetMC().AddConstraint(
            LinConLE({std::move(Ckr_0_d), lambda}, {0.0}) );
      auto Ckr_1_dp1 = GetMC().GetZZIExtendedColumn(r, k, 1, d+1);
      Ckr_1_dp1.push_back(-1.0);
      GetMC().AddConstraint(
            LinConGE({std::move(Ckr_1_dp1), lambda}, {0.0}) );
    }
  }